

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock-posix.c
# Opt level: O0

pboolean pp_rwlock_unlock_any(PRWLock *lock)

{
  int iVar1;
  PRWLock *lock_local;
  
  if (lock == (PRWLock *)0x0) {
    lock_local._4_4_ = 0;
  }
  else {
    iVar1 = pthread_rwlock_unlock((pthread_rwlock_t *)lock);
    if (iVar1 == 0) {
      lock_local._4_4_ = 1;
    }
    else {
      printf("** Error: %s **\n","PRWLock::pp_rwlock_unlock_any: pthread_rwlock_unlock() failed");
      lock_local._4_4_ = 0;
    }
  }
  return lock_local._4_4_;
}

Assistant:

static pboolean
pp_rwlock_unlock_any (PRWLock *lock)
{
	if (P_UNLIKELY (lock == NULL))
		return FALSE;

	if (P_LIKELY (pthread_rwlock_unlock (&lock->hdl) == 0))
		return TRUE;
	else {
		P_ERROR ("PRWLock::pp_rwlock_unlock_any: pthread_rwlock_unlock() failed");
		return FALSE;
	}
}